

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O0

void so_5::impl::msg_tracing_helpers::details::
     make_trace_to<std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::text_separator,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
               (ostream *s,type_index *a,intrusive_ptr_t<so_5::message_t> *other,
               text_separator *other_1,type_index *other_2,intrusive_ptr_t<so_5::message_t> *other_3
               )

{
  intrusive_ptr_t<so_5::message_t> *other_local_3;
  type_index *other_local_2;
  text_separator *other_local_1;
  intrusive_ptr_t<so_5::message_t> *other_local;
  type_index *a_local;
  ostream *s_local;
  
  make_trace_to_1(s,a);
  make_trace_to<so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::text_separator,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            (s,other,other_1,other_2,other_3);
  return;
}

Assistant:

void
make_trace_to( std::ostream & s, A && a, OTHER &&... other )
	{
		make_trace_to_1( s, std::forward< A >(a) );
		make_trace_to( s, std::forward< OTHER >(other)... );
	}